

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd3D.c
# Opt level: O0

void update_electric_field(fdtd3D *fdtd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double *in_RDI;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  uintmax_t i_2;
  uintmax_t k_1;
  uintmax_t j_1;
  uintmax_t i_1;
  uintmax_t k;
  uintmax_t j;
  uintmax_t i;
  float_type _dz;
  float_type _dy;
  float_type _dx;
  float_type_0__0_ *permittivity_inv;
  float_type_0__0_ *ez;
  float_type_0__0_ *ey;
  float_type_0__0_ *ex;
  float_type_0__0_ *hz;
  float_type_0__0_ *hy;
  float_type_0__0_ *hx;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  uintmax_t k_2;
  uintmax_t j_2;
  
  dVar1 = in_RDI[0x32];
  dVar2 = in_RDI[0x33];
  dVar3 = in_RDI[4];
  dVar4 = in_RDI[0x32];
  dVar5 = in_RDI[0x33];
  dVar6 = in_RDI[5];
  dVar7 = in_RDI[0x32];
  dVar8 = in_RDI[0x33];
  dVar9 = in_RDI[6];
  dVar10 = in_RDI[0x32];
  dVar11 = in_RDI[0x33];
  dVar12 = in_RDI[7];
  dVar13 = in_RDI[0x32];
  dVar14 = in_RDI[0x33];
  dVar15 = in_RDI[8];
  dVar16 = in_RDI[0x32];
  dVar17 = in_RDI[0x33];
  dVar18 = in_RDI[9];
  dVar19 = in_RDI[0x32];
  dVar20 = in_RDI[0x33];
  dVar21 = in_RDI[10];
  auVar26._0_8_ = 1.0 / *in_RDI;
  auVar22._0_8_ = 1.0 / in_RDI[1];
  auVar24._0_8_ = 1.0 / in_RDI[2];
  for (local_70 = 4.94065645841247e-324; (ulong)local_70 < (ulong)in_RDI[0x31];
      local_70 = (double)((long)local_70 + 1)) {
    for (local_78 = 4.94065645841247e-324; (ulong)local_78 < (ulong)in_RDI[0x32];
        local_78 = (double)((long)local_78 + 1)) {
      for (local_80 = 4.94065645841247e-324; (ulong)local_80 < (ulong)in_RDI[0x33];
          local_80 = (double)((long)local_80 + 1)) {
        auVar34._8_8_ = 0;
        auVar34._0_8_ =
             *(ulong *)((long)dVar12 + (long)local_70 * (long)dVar10 * (long)dVar11 * 8 +
                        (long)dVar11 * (long)local_78 * 8 + (long)local_80 * 8);
        auVar22._8_8_ = 0;
        auVar28._8_8_ = 0;
        auVar28._0_8_ =
             *(double *)
              ((long)dVar9 + (long)local_70 * (long)dVar7 * (long)dVar8 * 8 +
               (long)dVar8 * (long)local_78 * 8 + (long)local_80 * 8) -
             *(double *)
              ((long)dVar9 + (long)local_70 * (long)dVar7 * (long)dVar8 * 8 +
               ((long)local_78 + -1) * (long)dVar8 * 8 + (long)local_80 * 8);
        auVar37._8_8_ = 0;
        auVar37._0_8_ =
             -((*(double *)
                 ((long)dVar6 + (long)local_70 * (long)dVar4 * (long)dVar5 * 8 +
                  (long)dVar5 * (long)local_78 * 8 + (long)local_80 * 8) -
               *(double *)
                ((long)dVar6 + (long)local_70 * (long)dVar4 * (long)dVar5 * 8 +
                 (long)dVar5 * (long)local_78 * 8 + ((long)local_80 + -1) * 8)) * auVar24._0_8_);
        auVar27 = vfmadd213sd_fma(auVar22,auVar28,auVar37);
        auVar23._8_8_ = 0;
        auVar23._0_8_ =
             *(ulong *)((long)dVar21 + (long)local_70 * (long)dVar19 * (long)dVar20 * 8 +
                        (long)dVar20 * (long)local_78 * 8 + (long)local_80 * 8);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = auVar27._0_8_ * in_RDI[3];
        auVar27 = vfmadd213sd_fma(auVar23,auVar29,auVar34);
        *(long *)((long)dVar12 + (long)local_70 * (long)dVar10 * (long)dVar11 * 8 +
                  (long)dVar11 * (long)local_78 * 8 + (long)local_80 * 8) = auVar27._0_8_;
      }
    }
  }
  for (local_88 = 4.94065645841247e-324; (ulong)local_88 < (ulong)in_RDI[0x31];
      local_88 = (double)((long)local_88 + 1)) {
    for (local_90 = 4.94065645841247e-324; (ulong)local_90 < (ulong)in_RDI[0x32];
        local_90 = (double)((long)local_90 + 1)) {
      for (local_98 = 4.94065645841247e-324; (ulong)local_98 < (ulong)in_RDI[0x33];
          local_98 = (double)((long)local_98 + 1)) {
        auVar35._8_8_ = 0;
        auVar35._0_8_ =
             *(ulong *)((long)dVar15 + (long)local_88 * (long)dVar13 * (long)dVar14 * 8 +
                        (long)dVar14 * (long)local_90 * 8 + (long)local_98 * 8);
        auVar24._8_8_ = 0;
        auVar30._8_8_ = 0;
        auVar30._0_8_ =
             *(double *)
              ((long)dVar3 + (long)local_88 * (long)dVar1 * (long)dVar2 * 8 +
               (long)dVar2 * (long)local_90 * 8 + (long)local_98 * 8) -
             *(double *)
              ((long)dVar3 + (long)local_88 * (long)dVar1 * (long)dVar2 * 8 +
               (long)dVar2 * (long)local_90 * 8 + ((long)local_98 + -1) * 8);
        auVar38._8_8_ = 0;
        auVar38._0_8_ =
             -((*(double *)
                 ((long)dVar9 + (long)local_88 * (long)dVar7 * (long)dVar8 * 8 +
                  (long)dVar8 * (long)local_90 * 8 + (long)local_98 * 8) -
               *(double *)
                ((long)dVar9 + ((long)local_88 + -1) * (long)dVar7 * (long)dVar8 * 8 +
                 (long)dVar8 * (long)local_90 * 8 + (long)local_98 * 8)) * auVar26._0_8_);
        auVar27 = vfmadd213sd_fma(auVar24,auVar30,auVar38);
        auVar25._8_8_ = 0;
        auVar25._0_8_ =
             *(ulong *)((long)dVar21 + (long)local_88 * (long)dVar19 * (long)dVar20 * 8 +
                        (long)dVar20 * (long)local_90 * 8 + (long)local_98 * 8);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = auVar27._0_8_ * in_RDI[3];
        auVar27 = vfmadd213sd_fma(auVar25,auVar31,auVar35);
        *(long *)((long)dVar15 + (long)local_88 * (long)dVar13 * (long)dVar14 * 8 +
                  (long)dVar14 * (long)local_90 * 8 + (long)local_98 * 8) = auVar27._0_8_;
      }
    }
  }
  for (local_a0 = 4.94065645841247e-324; (ulong)local_a0 < (ulong)in_RDI[0x31];
      local_a0 = (double)((long)local_a0 + 1)) {
    for (local_a8 = 4.94065645841247e-324; (ulong)local_a8 < (ulong)in_RDI[0x32];
        local_a8 = (double)((long)local_a8 + 1)) {
      for (local_b0 = 4.94065645841247e-324; (ulong)local_b0 < (ulong)in_RDI[0x33];
          local_b0 = (double)((long)local_b0 + 1)) {
        auVar36._8_8_ = 0;
        auVar36._0_8_ =
             *(ulong *)((long)dVar18 + (long)local_a0 * (long)dVar16 * (long)dVar17 * 8 +
                        (long)dVar17 * (long)local_a8 * 8 + (long)local_b0 * 8);
        auVar26._8_8_ = 0;
        auVar32._8_8_ = 0;
        auVar32._0_8_ =
             *(double *)
              ((long)dVar6 + (long)local_a0 * (long)dVar4 * (long)dVar5 * 8 +
               (long)dVar5 * (long)local_a8 * 8 + (long)local_b0 * 8) -
             *(double *)
              ((long)dVar6 + ((long)local_a0 + -1) * (long)dVar4 * (long)dVar5 * 8 +
               (long)dVar5 * (long)local_a8 * 8 + (long)local_b0 * 8);
        auVar39._8_8_ = 0;
        auVar39._0_8_ =
             -((*(double *)
                 ((long)dVar3 + (long)local_a0 * (long)dVar1 * (long)dVar2 * 8 +
                  (long)dVar2 * (long)local_a8 * 8 + (long)local_b0 * 8) -
               *(double *)
                ((long)dVar3 + (long)local_a0 * (long)dVar1 * (long)dVar2 * 8 +
                 ((long)local_a8 + -1) * (long)dVar2 * 8 + (long)local_b0 * 8)) * auVar22._0_8_);
        auVar24 = vfmadd213sd_fma(auVar26,auVar32,auVar39);
        auVar27._8_8_ = 0;
        auVar27._0_8_ =
             *(ulong *)((long)dVar21 + (long)local_a0 * (long)dVar19 * (long)dVar20 * 8 +
                        (long)dVar20 * (long)local_a8 * 8 + (long)local_b0 * 8);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = auVar24._0_8_ * in_RDI[3];
        auVar24 = vfmadd213sd_fma(auVar27,auVar33,auVar36);
        *(long *)((long)dVar18 + (long)local_a0 * (long)dVar16 * (long)dVar17 * 8 +
                  (long)dVar17 * (long)local_a8 * 8 + (long)local_b0 * 8) = auVar24._0_8_;
      }
    }
  }
  return;
}

Assistant:

static void update_electric_field(struct fdtd3D *fdtd) {
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, hx,
                    fdtd->hx);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, hy,
                    fdtd->hy);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, hz,
                    fdtd->hz);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, ex,
                    fdtd->ex);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, ey,
                    fdtd->ey);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, ez,
                    fdtd->ez);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ,
                    permittivity_inv, fdtd->permittivity_inv);

  float_type _dx = float_cst(1.) / fdtd->dx;
  float_type _dy = float_cst(1.) / fdtd->dy;
  float_type _dz = float_cst(1.) / fdtd->dz;

  for (uintmax_t i = 1; i < fdtd->sizeX; ++i) {
    for (uintmax_t j = 1; j < fdtd->sizeY; ++j) {
      for (uintmax_t k = 1; k < fdtd->sizeZ; ++k) {
        ex[i][j][k] = ex[i][j][k] + ((hz[i][j][k] - hz[i][j - 1][k]) * _dy -
                                     (hy[i][j][k] - hy[i][j][k - 1]) * _dz) *
                                        fdtd->dt * permittivity_inv[i][j][k];
      }
    }
  }
  for (uintmax_t i = 1; i < fdtd->sizeX; ++i) {
    for (uintmax_t j = 1; j < fdtd->sizeY; ++j) {
      for (uintmax_t k = 1; k < fdtd->sizeZ; ++k) {
        ey[i][j][k] = ey[i][j][k] + ((hx[i][j][k] - hx[i][j][k - 1]) * _dz -
                                     (hz[i][j][k] - hz[i - 1][j][k]) * _dx) *
                                        fdtd->dt * permittivity_inv[i][j][k];
      }
    }
  }
  for (uintmax_t i = 1; i < fdtd->sizeX; ++i) {
    for (uintmax_t j = 1; j < fdtd->sizeY; ++j) {
      for (uintmax_t k = 1; k < fdtd->sizeZ; ++k) {
        ez[i][j][k] = ez[i][j][k] + ((hy[i][j][k] - hy[i - 1][j][k]) * _dx -
                                     (hx[i][j][k] - hx[i][j - 1][k]) * _dy) *
                                        fdtd->dt * permittivity_inv[i][j][k];
      }
    }
  }
}